

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

int __thiscall trackerboy::Player::progressMax(Player *this)

{
  __index_type _Var1;
  int iVar2;
  anon_class_1_0_00000001 local_9;
  
  _Var1 = *(__index_type *)
           ((long)&(this->mContext).
                   super__Variant_base<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                   .
                   super__Move_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                   .
                   super__Copy_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                   .
                   super__Move_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                   .
                   super__Copy_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                   .
                   super__Variant_storage_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
           + 0x28);
  if (_Var1 == 0xff) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    _Var1 = *(__index_type *)
             ((long)&(this->mContext).
                     super__Variant_base<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                     .
                     super__Move_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                     .
                     super__Copy_assign_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                     .
                     super__Move_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                     .
                     super__Copy_ctor_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
                     .
                     super__Variant_storage_alias<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>
             + 0x28);
  }
  iVar2 = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/build_O2/_deps/libtrackerboy-src/src/export/Player.cpp:90:23)_&&,_const_std::variant<std::monostate,_trackerboy::Player::LoopContext,_trackerboy::Player::DurationContext>_&>
            ::_S_vtable._M_arr[(char)_Var1]._M_data)(&local_9,&this->mContext);
  return iVar2;
}

Assistant:

int Player::progressMax() const {
    return std::visit([](auto&& ctx) {
        using T = std::decay_t<decltype(ctx)>;

        if constexpr (std::is_same_v<T, LoopContext>) {
            return ctx.loopAmount;
        } else if constexpr (std::is_same_v<T, DurationContext>) {
            return ctx.framesToPlay;
        } else {
            return 0;
        }
    }, mContext);
}